

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O0

uint8_t __thiscall Bus::cpuRead(Bus *this,uint16_t addr,bool bReadOnly)

{
  bool bVar1;
  element_type *this_00;
  const_reference pvVar2;
  uint8_t local_14;
  byte local_13;
  uint16_t local_12;
  uint8_t data;
  bool bReadOnly_local;
  Bus *pBStack_10;
  uint16_t addr_local;
  Bus *this_local;
  
  local_14 = '\0';
  local_13 = bReadOnly;
  local_12 = addr;
  pBStack_10 = this;
  this_00 = std::__shared_ptr_access<Catridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Catridge,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->cart);
  bVar1 = Catridge::cpuRead(this_00,local_12,&local_14);
  if (!bVar1) {
    if (local_12 < 0x2000) {
      pvVar2 = std::array<unsigned_char,_2048UL>::operator[]
                         (&this->cpuRam,(ulong)(local_12 & 0x7ff));
      local_14 = *pvVar2;
    }
    else if ((0x1fff < local_12) && (local_12 < 0x4000)) {
      local_14 = m2C02::cpuRead(&this->ppu,local_12 & 7,(bool)(local_13 & 1));
    }
  }
  return local_14;
}

Assistant:

uint8_t cpuRead(uint16_t addr, bool bReadOnly = false) const
  {
    uint8_t data = 0x00u;
    if (cart->cpuRead(addr, data))
    {
    }
    else if (addr >= 0x0000u && addr <= 0x1FFFu)
    {
      data = cpuRam[addr & 0x07FFu];
    }
    else if (addr >= 0x2000u && addr <= 0x3FFFu)
    {
      data = ppu.cpuRead(addr & 0x0007u, bReadOnly);
    }
    return data;
  }